

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execAndEaRg<(moira::Instr)9,(moira::Mode)8,(moira::Size)1>(Moira *this,u16 opcode)

{
  u32 uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar1 = computeEA<(moira::Mode)8,(moira::Size)1,0ul>(this,opcode & 7);
  uVar1 = readM<(moira::MemSpace)1,(moira::Size)1,0ul>(this,uVar1);
  uVar3 = (ulong)(opcode >> 9 & 7);
  uVar2 = uVar1 & *(uint *)((long)this->exec + uVar3 * 4 + -0x58);
  uVar4 = uVar2 & 0xff;
  (this->reg).sr.n = 0x7f < uVar4;
  (this->reg).sr.z = uVar4 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  uVar1 = (this->reg).pc;
  (this->reg).pc0 = uVar1;
  (this->queue).ird = (this->queue).irc;
  uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar1 + 2);
  (this->queue).irc = (u16)uVar1;
  *(char *)((long)this->exec + uVar3 * 4 + -0x58) = (char)uVar2;
  return;
}

Assistant:

void
Moira::execAndEaRg(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    u32 result = logic<I,S>(data, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(isRegMode(M) || isImmMode(M) ? 4 : 2);
    writeD<S>(dst, result);
}